

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

word Gia_ManAutomInit(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  ulong local_28;
  word Init;
  int Index;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  Init._4_4_ = 0;
  while( true ) {
    bVar4 = false;
    if (Init._4_4_ < p->nObjs) {
      _Index = Gia_ManObj(p,Init._4_4_);
      bVar4 = _Index != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(_Index);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninC0(_Index);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(_Index);
        iVar1 = Gia_ObjIsCi(pGVar3);
        if (iVar1 != 0) {
          pGVar3 = Gia_ObjFanin0(_Index);
          iVar1 = Gia_ObjCioId(pGVar3);
          iVar2 = Gia_ManPiNum(p);
          if (-1 < iVar1 - iVar2) {
            local_28 = 1L << (0x3fU - (char)(iVar1 - iVar2) & 0x3f) | local_28;
          }
        }
      }
      iVar1 = Gia_ObjFaninC1(_Index);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin1(_Index);
        iVar1 = Gia_ObjIsCi(pGVar3);
        if (iVar1 != 0) {
          pGVar3 = Gia_ObjFanin1(_Index);
          iVar1 = Gia_ObjCioId(pGVar3);
          iVar2 = Gia_ManPiNum(p);
          if (-1 < iVar1 - iVar2) {
            local_28 = 1L << (0x3fU - (char)(iVar1 - iVar2) & 0x3f) | local_28;
          }
        }
      }
    }
    Init._4_4_ = Init._4_4_ + 1;
  }
  return local_28;
}

Assistant:

word Gia_ManAutomInit( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int i, Index;
    word Init = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjFaninC0(pObj) && Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
        {
            Index = Gia_ObjCioId(Gia_ObjFanin0(pObj)) - Gia_ManPiNum(p);
            if ( Index >= 0 )
                Init |= ((word)1 << (63-Index));
        }
        if ( Gia_ObjFaninC1(pObj) && Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
        {
            Index = Gia_ObjCioId(Gia_ObjFanin1(pObj)) - Gia_ManPiNum(p);
            if ( Index >= 0 )
                Init |= ((word)1 << (63-Index));
        }
    }
    return Init;
}